

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

bool __thiscall choc::value::Type::Object::usesStrings(Object *this)

{
  MainType MVar1;
  MemberNameAndType *pMVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = (ulong)(this->members).size;
  if (uVar4 != 0) {
    pMVar2 = (this->members).items;
    lVar5 = 0;
    do {
      MVar1 = (&(pMVar2->type).mainType)[lVar5];
      if (MVar1 == object) {
        bVar3 = usesStrings(*(Object **)((long)&(pMVar2->type).content + lVar5));
        if (bVar3) {
          return true;
        }
      }
      else if (MVar1 == string) {
        return true;
      }
      lVar5 = lVar5 + 0x30;
    } while (uVar4 * 0x30 != lVar5);
  }
  return false;
}

Assistant:

ObjectType* end() const                     { return items + size; }